

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

void __thiscall TPZStructMatrix::Read(TPZStructMatrix *this,TPZStream *buf,void *context)

{
  TPZEquationFilter *this_00;
  TPZAutoPointer<TPZCompMesh> *this_01;
  TPZStream *in_RDI;
  TPZAutoPointer<TPZCompMesh> *rval;
  TPZStream *in_stack_ffffffffffffffb0;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  TPZStream *in_stack_ffffffffffffffd0;
  TPZAutoPointer<TPZCompMesh> local_28 [4];
  TPZStream *in;
  
  in = in_RDI;
  this_00 = (TPZEquationFilter *)TPZPersistenceManager::GetInstance(in_stack_ffffffffffffffb0);
  if (this_00 == (TPZEquationFilter *)0x0) {
    this_01 = (TPZAutoPointer<TPZCompMesh> *)0x0;
  }
  else {
    this_01 = (TPZAutoPointer<TPZCompMesh> *)
              __dynamic_cast(this_00,&TPZSavable::typeinfo,&TPZCompMesh::typeinfo,0xffffffffffffffff
                            );
  }
  in_RDI[1]._vptr_TPZStream = (_func_int **)this_01;
  rval = local_28;
  TPZPersistenceManager::GetAutoPointer(in_RDI);
  TPZAutoPointerDynamicCast<TPZCompMesh,TPZSavable>((TPZAutoPointer<TPZSavable> *)in);
  TPZAutoPointer<TPZCompMesh>::operator=(this_01,rval);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(this_01);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer((TPZAutoPointer<TPZSavable> *)this_01);
  TPZStream::Read<int>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TPZEquationFilter::Read(this_00,in_RDI,this_01);
  return;
}

Assistant:

void TPZStructMatrix::Read(TPZStream& buf, void* context) {
    //DO NOT READ FROM THE TPZMATPARINTERFACE
    fMesh = dynamic_cast<TPZCompMesh *>(TPZPersistenceManager::GetInstance(&buf));
    fCompMesh = TPZAutoPointerDynamicCast<TPZCompMesh>(TPZPersistenceManager::GetAutoPointer(&buf));
    buf.Read(fMaterialIds);
    fEquationFilter.Read(buf,context);
}